

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratAdvanced::ComputeStiffnessMatrix
          (ChElasticityCosseratAdvanced *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n
          ,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            (&K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,6,6);
  dVar10 = cos(this->alpha);
  auVar13._0_8_ = sin(this->alpha);
  auVar13._8_56_ = extraout_var;
  dVar1 = (this->super_ChElasticityCosseratSimple).E;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  dVar2 = (this->super_ChElasticityCosseratSimple).A;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2;
  dVar3 = (this->super_ChElasticityCosseratSimple).Iyy;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3;
  dVar4 = (this->super_ChElasticityCosseratSimple).Izz;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar4;
  dVar5 = this->Cz;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar10 * dVar10;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar13._0_8_ * auVar13._0_8_ * dVar4;
  auVar9 = vfmadd231sd_fma(auVar34,auVar25,auVar21);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar13._0_8_ * auVar13._0_8_ * dVar3;
  auVar21 = vfmadd231sd_fma(auVar32,auVar29,auVar21);
  dVar3 = this->Cy;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4 * dVar1;
  auVar17 = vfmsub231sd_fma(auVar30,auVar15,auVar25);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar5 * dVar5;
  auVar15 = vfmadd213sd_fma(auVar37,auVar19,auVar9);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3 * dVar3;
  auVar21 = vfmadd213sd_fma(auVar38,auVar19,auVar21);
  dVar6 = dVar2 * dVar5 * dVar1;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar9 = vxorpd_avx512vl(auVar22,auVar8);
  dVar7 = dVar2 * dVar1 * auVar9._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * dVar5 * dVar3 * dVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar10 * auVar17._0_8_;
  auVar16 = vfmsub231sd_fma(auVar16,auVar13._0_16_,auVar26);
  dVar11 = cos(this->beta);
  auVar14._0_8_ = sin(this->beta);
  auVar14._8_56_ = extraout_var_00;
  dVar3 = (this->super_ChElasticityCosseratSimple).G;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3;
  dVar4 = this->Sz;
  dVar5 = (this->super_ChElasticityCosseratSimple).A;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar11;
  dVar10 = dVar3 * (this->super_ChElasticityCosseratSimple).Ks_y * dVar5;
  dVar5 = dVar5 * dVar3 * (this->super_ChElasticityCosseratSimple).Ks_z;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->super_ChElasticityCosseratSimple).J;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar10 * dVar4 * dVar4;
  auVar9 = vfmadd231sd_fma(auVar35,auVar17,auVar9);
  dVar3 = this->Sy;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar10;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar11 * dVar11;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar14._0_8_ * auVar14._0_8_ * dVar5;
  auVar17 = vfmadd231sd_fma(auVar33,auVar23,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar11 * dVar11 * dVar5;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar14._0_8_ * auVar14._0_8_;
  auVar8 = vfmadd231sd_fma(auVar28,auVar23,auVar31);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3 * dVar3;
  auVar9 = vfmadd213sd_fma(auVar36,auVar20,auVar9);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5 * dVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar11 * dVar4 * dVar10;
  auVar19 = vfmsub231sd_fma(auVar24,auVar18,auVar14._0_16_);
  dVar11 = dVar11 * auVar14._0_8_ * (dVar5 - dVar10);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar14._0_8_ * dVar4 * dVar10;
  auVar12 = vfmadd231sd_fma(auVar12,auVar18,auVar39);
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       dVar1 * dVar2;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[4] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[5] =
       dVar7;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       auVar17._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       dVar11;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       auVar19._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       dVar11;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar8._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       auVar12._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13] =
       auVar19._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x14] =
       auVar12._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       auVar9._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x18] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       auVar15._0_8_ * dVar1;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       auVar16._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       dVar7;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       auVar16._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       auVar21._0_8_ * dVar1;
  return;
}

Assistant:

void ChElasticityCosseratAdvanced::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                          const ChVector<>& strain_n,
                                                          const ChVector<>& strain_m) {
    K.setZero(6, 6);
    double cos_alpha = cos(alpha);
    double sin_alpha = sin(alpha);
    double a11 = E * A;
    double a22 = E * (Iyy * pow(cos_alpha, 2.) + Izz * pow(sin_alpha, 2.) + Cz * Cz * A);
    double a33 = E * (Izz * pow(cos_alpha, 2.) + Iyy * pow(sin_alpha, 2.) + Cy * Cy * A);
    double a12 = Cz * E * A;
    double a13 = -Cy * E * A;
    double a23 = (E * Iyy - E * Izz) * cos_alpha * sin_alpha - E * Cy * Cz * A;
    double cos_beta = cos(beta);
    double sin_beta = sin(beta);
    double KsyGA = Ks_y * G * A;
    double KszGA = Ks_z * G * A;
    double s11 = KsyGA * pow(cos_beta, 2.) + KszGA * pow(sin_beta, 2.);
    double s22 = KsyGA * pow(sin_beta, 2.) + KszGA * pow(cos_beta, 2.);  // ..+s_loc_12*sin(beta)*cos(beta);
    double s33 = G * J + Sz * Sz * KsyGA + Sy * Sy * KszGA;
    double s12 = (KszGA - KsyGA) * sin_beta * cos_beta;
    double s13 = Sy * KszGA * sin_beta - Sz * KsyGA * cos_beta;
    double s23 = Sy * KszGA * cos_beta + Sz * KsyGA * sin_beta;

    K(0, 0) = a11;
    K(0, 4) = a12;
    K(0, 5) = a13;
    K(1, 1) = s11;
    K(1, 2) = s12;
    K(1, 3) = s13;
    K(2, 1) = s12;
    K(2, 2) = s22;
    K(2, 3) = s23;
    K(3, 1) = s13;
    K(3, 2) = s23;
    K(3, 3) = s33;
    K(4, 0) = a12;
    K(4, 4) = a22;
    K(4, 5) = a23;
    K(5, 0) = a13;
    K(5, 4) = a23;
    K(5, 5) = a33;
}